

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logistics_Header.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Logistics_Header::Logistics_Header
          (Logistics_Header *this,EntityIdentifier *ReceivingEntityID,
          EntityIdentifier *SupplyingEntityID)

{
  KUINT16 KVar1;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 = (_func_int **)&PTR__Logistics_Header_002336a0;
  (this->m_ReceivingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00224f60;
  KVar1 = (ReceivingEntityID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_ReceivingEntity).super_SimulationIdentifier.m_ui16SiteID =
       (ReceivingEntityID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_ReceivingEntity).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_ReceivingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00224c00;
  *(undefined2 *)&(this->m_ReceivingEntity).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(ReceivingEntityID->super_SimulationIdentifier).field_0xc;
  (this->m_SupplyingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00224f60;
  KVar1 = (SupplyingEntityID->super_SimulationIdentifier).m_ui16ApplicationID;
  (this->m_SupplyingEntity).super_SimulationIdentifier.m_ui16SiteID =
       (SupplyingEntityID->super_SimulationIdentifier).m_ui16SiteID;
  (this->m_SupplyingEntity).super_SimulationIdentifier.m_ui16ApplicationID = KVar1;
  (this->m_SupplyingEntity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EntityIdentifier_00224c00;
  *(undefined2 *)&(this->m_SupplyingEntity).super_SimulationIdentifier.field_0xc =
       *(undefined2 *)&(SupplyingEntityID->super_SimulationIdentifier).field_0xc;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x03';
  return;
}

Assistant:

Logistics_Header::Logistics_Header( const EntityIdentifier & ReceivingEntityID, const EntityIdentifier & SupplyingEntityID ) :
    m_ReceivingEntity( ReceivingEntityID ),
    m_SupplyingEntity( SupplyingEntityID )
{
    m_ui8ProtocolFamily = Logistics;
}